

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URL.cpp
# Opt level: O2

void __thiscall URL::URL(URL *this,string *url)

{
  string *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  string *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  string *local_58;
  string *local_50;
  string *local_48;
  string *local_40;
  string *local_38;
  
  (this->_url)._M_dataplus._M_p = (pointer)&(this->_url).field_2;
  (this->_url)._M_string_length = 0;
  (this->_url).field_2._M_local_buf[0] = '\0';
  (this->_host)._M_dataplus._M_p = (pointer)&(this->_host).field_2;
  (this->_host)._M_string_length = 0;
  (this->_host).field_2._M_local_buf[0] = '\0';
  (this->_protocoll)._M_dataplus._M_p = (pointer)&(this->_protocoll).field_2;
  (this->_protocoll)._M_string_length = 0;
  (this->_protocoll).field_2._M_local_buf[0] = '\0';
  (this->_portNumber)._M_dataplus._M_p = (pointer)&(this->_portNumber).field_2;
  (this->_portNumber)._M_string_length = 0;
  local_70 = &this->_host;
  (this->_portNumber).field_2._M_local_buf[0] = '\0';
  (this->_relativePath)._M_dataplus._M_p = (pointer)&(this->_relativePath).field_2;
  (this->_relativePath)._M_string_length = 0;
  this_00 = &this->_protocoll;
  local_68 = (string *)&this->_portNumber;
  (this->_relativePath).field_2._M_local_buf[0] = '\0';
  (this->_queryString)._M_dataplus._M_p = (pointer)&(this->_queryString).field_2;
  (this->_queryString)._M_string_length = 0;
  local_40 = (string *)&this->_relativePath;
  local_50 = (string *)&this->_queryString;
  (this->_queryString).field_2._M_local_buf[0] = '\0';
  local_48 = &this->SECUREPROTOCOLPORT;
  std::__cxx11::string::string((string *)local_48,"443",(allocator *)&local_90);
  local_58 = &this->REGULAREPROTOCOLPORT;
  std::__cxx11::string::string((string *)local_58,"80",(allocator *)&local_90);
  std::__cxx11::string::string((string *)&this->REGULARPROTOCOL,"http",(allocator *)&local_90);
  local_60 = &this->SECUREPROTOCOL;
  local_38 = &this->REGULARPROTOCOL;
  std::__cxx11::string::string((string *)local_60,"https",(allocator *)&local_90);
  std::__cxx11::string::_M_assign((string *)this);
  iVar2 = std::__cxx11::string::find((char *)url,0x10733a);
  if (iVar2 == -1) {
    std::__cxx11::string::_M_assign((string *)this_00);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_90,(ulong)url);
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::substr((ulong)&local_90,(ulong)url);
    std::__cxx11::string::operator=((string *)url,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
  }
  iVar2 = std::__cxx11::string::find((char *)url,0x10733c);
  iVar3 = std::__cxx11::string::find((char *)url,0x10733e);
  iVar4 = std::__cxx11::string::find((char *)url,0x107340);
  if (iVar3 == -1) {
    std::__cxx11::string::string((string *)&local_90,(string *)this_00);
    std::operator==(&local_90,local_60);
    std::__cxx11::string::~string((string *)&local_90);
    __lhs = local_70;
    std::__cxx11::string::_M_assign(local_68);
  }
  else {
    if (iVar2 == -1) {
      iVar2 = (int)url->_M_string_length;
    }
    std::__cxx11::string::substr((ulong)&local_90,(ulong)url);
    std::__cxx11::string::operator=(local_68,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::substr((ulong)&local_90,(ulong)url);
    __lhs = local_70;
    std::__cxx11::string::operator=((string *)local_70,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
  }
  bVar1 = std::operator==(__lhs,"");
  if (bVar1) {
    if (iVar2 == -1) {
      std::__cxx11::string::_M_assign((string *)__lhs);
      goto LAB_00106806;
    }
    std::__cxx11::string::substr((ulong)&local_90,(ulong)url);
    std::__cxx11::string::operator=((string *)__lhs,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
  }
  else if (iVar2 == -1) goto LAB_00106806;
  std::__cxx11::string::substr((ulong)&local_90,(ulong)url);
  std::__cxx11::string::operator=(local_40,(string *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
LAB_00106806:
  if (iVar4 != -1) {
    std::__cxx11::string::substr((ulong)&local_90,(ulong)url);
    std::__cxx11::string::operator=(local_50,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
  }
  return;
}

Assistant:

URL::URL(std::string url) {
  _url = url;
  // Get the protocoll end pos
  int protocollPos = url.find("://");

  if (protocollPos == std::string::npos) {
    _protocoll = REGULARPROTOCOL;
    protocollPos = 0;
  } else {
    _protocoll = url.substr(0, protocollPos);
    // Remove the protocoll part from the url
    url = url.substr(protocollPos+3, url.size());
  }

  /* Find the hostname ended by / or by : depending on if
  port is specified or not */

  int hostNameEndPos = url.find("/");
  int portEndPos = url.find(":");

  int queryStringStartPos = url.find("?");

  // If the port position do not exists, set default to 80
  if (portEndPos == std::string::npos) {
    if (this->GetProtocoll() == SECUREPROTOCOL) {
      _portNumber = SECUREPROTOCOLPORT;
    } else {
      _portNumber = REGULAREPROTOCOLPORT;
    }
  } else {
    /* If there is nothing more than the hostname e.g. www.google.com,
    get the last position
    */
    if (hostNameEndPos == string::npos) {
      hostNameEndPos = url.size();
    }
    // If there is a port specified, e.g. www.google.com:80/subfolder
    _portNumber = url.substr(portEndPos+1, hostNameEndPos-(portEndPos+1));
    _host = url.substr(0, portEndPos);
  }

  // If the host was not set by due to that the port was not specified
  if (_host == "") {
    if (hostNameEndPos == string::npos) {
      _host = url;
    } else {
      _host = url.substr(0, hostNameEndPos);
    }
  }

  // Set the relative part of the URL
  if (hostNameEndPos != string::npos) {
    _relativePath = url.substr(hostNameEndPos, url.size()-hostNameEndPos);
  }

  // Set the query string part of the URL
  if (queryStringStartPos != string::npos) {
      _queryString = url.substr(queryStringStartPos,
                                url.size()-queryStringStartPos);
    }
}